

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QList<int> * __thiscall
QDockAreaLayout::findSeparator(QList<int> *__return_storage_ptr__,QDockAreaLayout *this,QPoint *pos)

{
  undefined1 auVar1 [16];
  int *piVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  int i;
  int index;
  long lVar7;
  QDockAreaLayoutInfo *this_00;
  ulong uVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_60;
  undefined1 local_48 [12];
  Representation RStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar7 = 0;
  do {
    this_00 = this->docks + lVar7;
    uVar8 = 0xffffffffffffffff;
    lVar6 = 0;
    do {
      uVar8 = uVar8 + 1;
      if ((ulong)(this_00->item_list).d.size <= uVar8) {
        bVar3 = false;
        goto LAB_003fd44d;
      }
      bVar3 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&((this_00->item_list).d.ptr)->widgetItem + lVar6));
      lVar6 = lVar6 + 0x28;
    } while (bVar3);
    stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    index = (int)lVar7;
    _local_48 = separatorRect(this,index);
    auVar1._4_4_ = -(uint)(local_48._8_4_ == local_48._0_4_ + -1);
    auVar1._0_4_ = -(uint)(local_48._8_4_ == local_48._0_4_ + -1);
    auVar1._8_4_ = -(uint)(RStack_3c.m_i == local_48._4_4_ + -1);
    auVar1._12_4_ = -(uint)(RStack_3c.m_i == local_48._4_4_ + -1);
    iVar5 = movmskpd(local_48._0_4_,auVar1);
    if ((iVar5 != 3) && (this->sep == 1)) {
      local_48._4_4_ = local_48._4_4_ + -2;
      local_48._0_4_ = local_48._0_4_ + -2;
      local_48._8_4_ = local_48._8_4_ + 2;
      RStack_3c.m_i = RStack_3c.m_i + 2;
    }
    cVar4 = QRect::contains((QPoint *)local_48,SUB81(pos,0));
    if (cVar4 == '\0') {
LAB_003fd39c:
      bVar3 = false;
      cVar4 = QRect::contains((QPoint *)&this_00->rect,SUB81(pos,0));
      if (cVar4 != '\0') {
        QDockAreaLayoutInfo::findSeparator((QList<int> *)&local_60,this_00,pos);
        QArrayDataPointer<int>::operator=(&__return_storage_ptr__->d,&local_60);
        piVar2 = (int *)CONCAT44(local_60.d._4_4_,(int)local_60.d);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(local_60.d._4_4_,(int)local_60.d),4,0x10);
          }
        }
        if ((__return_storage_ptr__->d).size != 0) {
          local_60.d._0_4_ = index;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)__return_storage_ptr__,0,(int *)&local_60);
          goto LAB_003fd447;
        }
      }
    }
    else {
      bVar3 = QDockAreaLayoutInfo::hasFixedSize(this_00);
      if (bVar3) goto LAB_003fd39c;
      local_60.d._0_4_ = index;
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                 (int *)&local_60);
      QList<int>::end(__return_storage_ptr__);
LAB_003fd447:
      bVar3 = true;
    }
LAB_003fd44d:
    if ((bVar3) || (lVar7 = lVar7 + 1, lVar7 == 4)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

QList<int> QDockAreaLayout::findSeparator(const QPoint &pos) const
{
    QList<int> result;
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &info = docks[i];
        if (info.isEmpty())
            continue;
        QRect rect = separatorRect(i);
        if (!rect.isNull() && sep == 1)
            rect.adjust(-2, -2, 2, 2);
        if (rect.contains(pos) && !info.hasFixedSize()) {
            result << i;
            break;
        } else if (info.rect.contains(pos)) {
            result = docks[i].findSeparator(pos);
            if (!result.isEmpty()) {
                result.prepend(i);
                break;
            }
        }
    }

    return result;
}